

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

void full_path(char *out,char *in)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int len;
  char *in_local;
  char *out_local;
  
  if (*in == '/') {
    strncpy(out,in,0x1000);
    out[0xfff] = '\0';
  }
  else {
    pcVar2 = getcwd(out,0x1000);
    if (pcVar2 != (char *)0x0) {
      sVar3 = strlen(out);
      iVar1 = (int)sVar3;
      sVar3 = strlen(in);
      if ((long)(iVar1 + 1) + sVar3 < 0x1000) {
        sprintf(out + iVar1,"/%.*s",(ulong)(0x1000 - iVar1),in);
        return;
      }
    }
    strncpy(out,in,0x1000);
    out[0xfff] = '\0';
  }
  return;
}

Assistant:

static void full_path(char *out, char *in) {
    if (*in == '/') {
	strncpy(out, in, PATH_MAX);
	out[PATH_MAX-1] = 0;
    } else {
	int len;

	// unable to get dir or out+in is too long
	if (!getcwd(out, PATH_MAX) ||
	    (len = strlen(out))+1+strlen(in) >= PATH_MAX) {
	    strncpy(out, in, PATH_MAX);
	    out[PATH_MAX-1] = 0;
	    return;
	}

	sprintf(out+len, "/%.*s", PATH_MAX - len, in);

	// FIXME: cope with `pwd`/../../../foo.fa ?
    }
}